

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O2

bool __thiscall GCSFilter::MatchInternal(GCSFilter *this,uint64_t *element_hashes,size_t size)

{
  long lVar1;
  uint uVar2;
  uint64_t uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  BitStreamReader<SpanReader> bitreader;
  SpanReader stream;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  stream.m_data.m_data =
       (this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  uVar5 = (long)(this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)stream.m_data.m_data;
  stream.m_data.m_size = uVar5;
  uVar3 = ReadCompactSize<SpanReader>(&stream,true);
  uVar6 = (ulong)this->m_N;
  if (uVar3 != uVar6) {
    __assert_fail("N == m_N",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockfilter.cpp"
                  ,0x6d,"bool GCSFilter::MatchInternal(const uint64_t *, size_t) const");
  }
  bitreader.m_buffer = '\0';
  bitreader.m_offset = 8;
  uVar8 = 0;
  sVar7 = 0;
  uVar2 = 0;
  bitreader.m_istream = &stream;
  while( true ) {
    bVar4 = (byte)uVar5;
    if ((uint)uVar6 <= uVar2) break;
    uVar3 = GolombRiceDecode<SpanReader>(&bitreader,(this->m_params).m_P);
    uVar8 = uVar8 + uVar3;
    while( true ) {
      bVar4 = size != sVar7;
      uVar5 = (ulong)bVar4;
      if ((size == sVar7) || (element_hashes[sVar7] == uVar8)) goto LAB_003afffa;
      if (uVar8 < element_hashes[sVar7]) break;
      sVar7 = sVar7 + 1;
    }
    uVar2 = uVar2 + 1;
    uVar6 = (ulong)this->m_N;
  }
LAB_003afffa:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(uVar2 < (uint)uVar6 & bVar4);
  }
  __stack_chk_fail();
}

Assistant:

bool GCSFilter::MatchInternal(const uint64_t* element_hashes, size_t size) const
{
    SpanReader stream{m_encoded};

    // Seek forward by size of N
    uint64_t N = ReadCompactSize(stream);
    assert(N == m_N);

    BitStreamReader bitreader{stream};

    uint64_t value = 0;
    size_t hashes_index = 0;
    for (uint32_t i = 0; i < m_N; ++i) {
        uint64_t delta = GolombRiceDecode(bitreader, m_params.m_P);
        value += delta;

        while (true) {
            if (hashes_index == size) {
                return false;
            } else if (element_hashes[hashes_index] == value) {
                return true;
            } else if (element_hashes[hashes_index] > value) {
                break;
            }

            hashes_index++;
        }
    }

    return false;
}